

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

int parse_destination_token(Context_conflict2 *ctx)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  RegisterType RVar6;
  RegisterType RVar7;
  bool bVar8;
  Token TVar9;
  int iVar10;
  DestArgInfo *info_00;
  uint local_5c;
  uint *local_40;
  char *ptr;
  uint tokenlen;
  char cStack_2c;
  char cStack_2b;
  char cStack_2a;
  char tokenbytes [5];
  int implicit_writemask;
  int invalid_writemask;
  int invalid_modifier;
  DestArgInfo *info;
  Context_conflict2 *ctx_local;
  
  info_00 = &ctx->dest_arg;
  memset(info_00,0,0x38);
  bVar8 = false;
  while (ctx->tokenlen != 0 && !bVar8) {
    iVar10 = check_token_segment(ctx,"_x2");
    if (iVar10 == 0) {
      iVar10 = check_token_segment(ctx,"_x4");
      if (iVar10 == 0) {
        iVar10 = check_token_segment(ctx,"_x8");
        if (iVar10 == 0) {
          iVar10 = check_token_segment(ctx,"_d8");
          if (iVar10 == 0) {
            iVar10 = check_token_segment(ctx,"_d4");
            if (iVar10 == 0) {
              iVar10 = check_token_segment(ctx,"_d2");
              if (iVar10 == 0) {
                iVar10 = check_token_segment(ctx,"_sat");
                if (iVar10 == 0) {
                  iVar10 = check_token_segment(ctx,"_pp");
                  if (iVar10 == 0) {
                    iVar10 = check_token_segment(ctx,"_centroid");
                    if (iVar10 == 0) {
                      bVar8 = true;
                    }
                    else {
                      (ctx->dest_arg).result_mod = (ctx->dest_arg).result_mod | 4;
                    }
                  }
                  else {
                    (ctx->dest_arg).result_mod = (ctx->dest_arg).result_mod | 2;
                  }
                }
                else {
                  (ctx->dest_arg).result_mod = (ctx->dest_arg).result_mod | 1;
                }
              }
              else {
                set_result_shift(ctx,info_00,0xf);
              }
            }
            else {
              set_result_shift(ctx,info_00,0xe);
            }
          }
          else {
            set_result_shift(ctx,info_00,0xd);
          }
        }
        else {
          set_result_shift(ctx,info_00,3);
        }
      }
      else {
        set_result_shift(ctx,info_00,2);
      }
    }
    else {
      set_result_shift(ctx,info_00,1);
    }
  }
  if (bVar8) {
    fail(ctx,"Invalid destination modifier");
  }
  TVar9 = nexttoken(ctx);
  if (TVar9 == 0x28) {
    fail(ctx,"Predicates unsupported at this time");
  }
  pushback(ctx);
  parse_register_name(ctx,&(ctx->dest_arg).regtype,&(ctx->dest_arg).regnum);
  if (ctx->tokenlen != 0) {
    fail(ctx,"invalid register name");
  }
  tokenbytes[1] = '\0';
  tokenbytes[2] = '\0';
  tokenbytes[3] = '\0';
  tokenbytes[4] = '\0';
  cStack_2c = '\0';
  cStack_2b = '\0';
  cStack_2a = '\0';
  tokenbytes[0] = '\0';
  TVar9 = nexttoken(ctx);
  if (TVar9 == 0x2e) {
    iVar10 = scalar_register(ctx->shader_type,(ctx->dest_arg).regtype,(ctx->dest_arg).regnum);
    if ((iVar10 == 0) || ((ctx->dest_arg).regtype == REG_TYPE_DEPTHOUT)) {
      TVar9 = nexttoken(ctx);
      if (TVar9 == TOKEN_IDENTIFIER) {
        memset((void *)((long)&ptr + 7),0,5);
        ptr._0_4_ = ctx->tokenlen;
        local_5c = (uint)ptr;
        if (3 < (uint)ptr) {
          local_5c = 4;
        }
        memcpy((void *)((long)&ptr + 7),ctx->token,(ulong)local_5c);
        local_40 = (uint *)((long)&ptr + 7);
        if ((ptr._7_1_ == 'r') || (ptr._7_1_ == 'x')) {
          (ctx->dest_arg).writemask0 = 1;
          local_40 = &tokenlen;
        }
        if (((char)*local_40 == 'g') || ((char)*local_40 == 'y')) {
          (ctx->dest_arg).writemask1 = 1;
          local_40 = (uint *)((long)local_40 + 1);
        }
        if (((char)*local_40 == 'b') || ((char)*local_40 == 'z')) {
          (ctx->dest_arg).writemask2 = 1;
          local_40 = (uint *)((long)local_40 + 1);
        }
        if (((char)*local_40 == 'a') || ((char)*local_40 == 'w')) {
          (ctx->dest_arg).writemask3 = 1;
          local_40 = (uint *)((long)local_40 + 1);
        }
        if ((char)*local_40 != '\0') {
          tokenbytes[1] = '\x01';
          tokenbytes[2] = '\0';
          tokenbytes[3] = '\0';
          tokenbytes[4] = '\0';
        }
        (ctx->dest_arg).writemask =
             (ctx->dest_arg).writemask0 & 1U | ((ctx->dest_arg).writemask1 & 1U) << 1 |
             ((ctx->dest_arg).writemask2 & 1U) << 2 | ((ctx->dest_arg).writemask3 & 1U) << 3;
      }
      else {
        tokenbytes[1] = '\x01';
        tokenbytes[2] = '\0';
        tokenbytes[3] = '\0';
        tokenbytes[4] = '\0';
      }
    }
    else {
      fail(ctx,"Writemask specified for scalar register");
    }
  }
  else {
    cStack_2c = '\x01';
    cStack_2b = '\0';
    cStack_2a = '\0';
    tokenbytes[0] = '\0';
    (ctx->dest_arg).writemask = 0xf;
    (ctx->dest_arg).writemask3 = 1;
    (ctx->dest_arg).writemask2 = 1;
    (ctx->dest_arg).writemask1 = 1;
    (ctx->dest_arg).writemask0 = 1;
    pushback(ctx);
  }
  if (tokenbytes._1_4_ != 0) {
    fail(ctx,"Invalid writemask");
  }
  if ((((ctx->dest_arg).regtype == REG_TYPE_DEPTHOUT) && (_cStack_2c == 0)) &&
     (1 < (ctx->dest_arg).writemask0 + (ctx->dest_arg).writemask1 + (ctx->dest_arg).writemask2 +
          (ctx->dest_arg).writemask3)) {
    fail(ctx,"Writemask specified for scalar register");
  }
  (ctx->dest_arg).orig_writemask = (ctx->dest_arg).writemask;
  iVar10 = tokenbuf_overflow(ctx);
  if (iVar10 == 0) {
    uVar1 = (ctx->dest_arg).regnum;
    uVar2 = (ctx->dest_arg).relative;
    uVar3 = (ctx->dest_arg).result_mod;
    uVar4 = (ctx->dest_arg).result_shift;
    uVar5 = (ctx->dest_arg).writemask;
    RVar6 = (ctx->dest_arg).regtype;
    RVar7 = (ctx->dest_arg).regtype;
    iVar10 = ctx->tokenbufpos;
    ctx->tokenbufpos = iVar10 + 1;
    ctx->tokenbuf[iVar10] =
         uVar1 & 0x7ff | 0x80000000 | (uVar2 & 1) << 0xd | (uVar3 & 0xf) << 0x14 |
         (uVar4 & 0xf) << 0x18 | (uVar5 & 0xf) << 0x10 | (RVar6 & REG_TYPE_CONSTINT) << 0x1c |
         (RVar7 & (REG_TYPE_TEMPFLOAT16|REG_TYPE_COLOROUT)) << 8;
  }
  return 1;
}

Assistant:

static int parse_destination_token(Context *ctx, DestArgInfo *info)
{
    // !!! FIXME: recheck against the spec for ranges (like RASTOUT values, etc).
    if (ctx->tokencount == 0)
    {
        fail(ctx, "Out of tokens in destination parameter");
        return 0;
    } // if

    const uint32 token = SWAP32(*(ctx->tokens));
    const int reserved1 = (int) ((token >> 14) & 0x3); // bits 14 through 15
    const int reserved2 = (int) ((token >> 31) & 0x1); // bit 31

    info->token = ctx->tokens;
    info->regnum = (int) (token & 0x7ff);  // bits 0 through 10
    info->relative = (int) ((token >> 13) & 0x1); // bit 13
    info->orig_writemask = (int) ((token >> 16) & 0xF); // bits 16 through 19
    info->result_mod = (int) ((token >> 20) & 0xF); // bits 20 through 23
    info->result_shift = (int) ((token >> 24) & 0xF); // bits 24 through 27      abc
    info->regtype = (RegisterType) (((token >> 28) & 0x7) | ((token >> 8) & 0x18));  // bits 28-30, 11-12

    int writemask;
    if (isscalar(ctx, ctx->shader_type, info->regtype, info->regnum))
        writemask = 0x1;  // just x.
    else
        writemask = info->orig_writemask;

    set_dstarg_writemask(info, writemask);  // bits 16 through 19.

    // all the REG_TYPE_CONSTx types are the same register type, it's just
    //  split up so its regnum can be > 2047 in the bytecode. Clean it up.
    if (info->regtype == REG_TYPE_CONST2)
    {
        info->regtype = REG_TYPE_CONST;
        info->regnum += 2048;
    } // else if
    else if (info->regtype == REG_TYPE_CONST3)
    {
        info->regtype = REG_TYPE_CONST;
        info->regnum += 4096;
    } // else if
    else if (info->regtype == REG_TYPE_CONST4)
    {
        info->regtype = REG_TYPE_CONST;
        info->regnum += 6144;
    } // else if

    // swallow token for now, for multiple calls in a row.
    adjust_token_position(ctx, 1);

    if (reserved1 != 0x0)
        fail(ctx, "Reserved bit #1 in destination token must be zero");

    if (reserved2 != 0x1)
        fail(ctx, "Reserved bit #2 in destination token must be one");

    if (info->relative)
    {
        if (!shader_is_vertex(ctx))
            fail(ctx, "Relative addressing in non-vertex shader");
        if (!shader_version_atleast(ctx, 3, 0))
            fail(ctx, "Relative addressing in vertex shader version < 3.0");
        if ((!ctx->ctab.have_ctab) && (!ctx->ignores_ctab))
        {
            // it's hard to do this efficiently without!
            fail(ctx, "relative addressing unsupported without a CTAB");
        } // if

        // !!! FIXME: I don't have a shader that has a relative dest currently.
        fail(ctx, "Relative addressing of dest tokens is unsupported");
        return 2;
    } // if

    const int s = info->result_shift;
    if (s != 0)
    {
        if (!shader_is_pixel(ctx))
            fail(ctx, "Result shift scale in non-pixel shader");
        if (shader_version_atleast(ctx, 2, 0))
            fail(ctx, "Result shift scale in pixel shader version >= 2.0");
        if ( ! (((s >= 1) && (s <= 3)) || ((s >= 0xD) && (s <= 0xF))) )
            fail(ctx, "Result shift scale isn't 1 to 3, or 13 to 15.");
    } // if

    if (info->result_mod & MOD_PP)  // Partial precision (pixel shaders only)
    {
        if (!shader_is_pixel(ctx))
            fail(ctx, "Partial precision result mod in non-pixel shader");
    } // if

    if (info->result_mod & MOD_CENTROID)  // Centroid (pixel shaders only)
    {
        if (!shader_is_pixel(ctx))
            fail(ctx, "Centroid result mod in non-pixel shader");
        else if (!ctx->centroid_allowed)  // only on DCL opcodes!
            fail(ctx, "Centroid modifier not allowed here");
    } // if

    if (/*(info->regtype < 0) ||*/ (info->regtype > REG_TYPE_MAX))
        fail(ctx, "Register type is out of range");

    if (!isfail(ctx))
        set_used_register(ctx, info->regtype, info->regnum, 1);

    return 1;
}